

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O1

float vorbis_lpc_from_data(float *data,float *lpci,int n,int m)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  double *pdVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  bool bVar15;
  float fVar16;
  double dVar17;
  double extraout_XMM0_Qa;
  double dVar18;
  double dVar19;
  double adStack_70 [4];
  long local_50;
  ulong local_48;
  float *local_40;
  ulong local_38;
  
  local_40 = lpci;
  pdVar13 = (double *)((long)adStack_70 + (8 - ((long)(m + 1) * 8 + 0xfU & 0xfffffffffffffff0)));
  lVar2 = (long)m;
  pdVar14 = (double *)((long)pdVar13 - (lVar2 * 8 + 0xfU & 0xfffffffffffffff0));
  if (m != -1) {
    lVar5 = lVar2 * 4;
    do {
      dVar17 = 0.0;
      pfVar7 = data;
      for (lVar10 = lVar2; lVar10 < n; lVar10 = lVar10 + 1) {
        dVar17 = dVar17 + (double)*pfVar7 * (double)*(float *)((long)pfVar7 + lVar5);
        pfVar7 = pfVar7 + 1;
      }
      pdVar13[lVar2] = dVar17;
      lVar5 = lVar5 + -4;
      bVar15 = lVar2 != 0;
      lVar2 = lVar2 + -1;
    } while (bVar15);
  }
  dVar17 = *pdVar13 * 1e-09 + 1e-10;
  local_50 = (long)m;
  local_38 = CONCAT44(in_register_0000000c,m);
  uVar9 = 0;
  if (0 < m) {
    uVar9 = (ulong)(uint)m;
  }
  pdVar12 = pdVar14 + -1;
  adStack_70[3] = dVar17;
  local_48 = uVar9;
  uVar3 = 0;
  pdVar11 = pdVar13;
  dVar19 = *pdVar13 * 1.0000000001;
  do {
    if (uVar3 == uVar9) goto LAB_006f6fab;
    if (dVar17 <= dVar19) {
      dVar18 = -pdVar13[uVar3 + 1];
      if (uVar3 != 0) {
        uVar8 = 0;
        pdVar6 = pdVar11;
        do {
          dVar18 = dVar18 - *pdVar6 * pdVar14[uVar8];
          uVar8 = uVar8 + 1;
          pdVar6 = pdVar6 + -1;
        } while (uVar3 != uVar8);
      }
      dVar18 = dVar18 / dVar19;
      pdVar14[uVar3] = dVar18;
      lVar2 = 0;
      pdVar6 = pdVar14;
      if (1 < uVar3) {
        do {
          dVar1 = *pdVar6;
          *pdVar6 = pdVar12[lVar2] * dVar18 + dVar1;
          pdVar12[lVar2] = dVar1 * dVar18 + pdVar12[lVar2];
          lVar2 = lVar2 + -1;
          pdVar6 = pdVar6 + 1;
        } while (-(ulong)(uVar3 >> 1 == 0) - (uVar3 >> 1) != lVar2);
        lVar2 = -lVar2;
      }
      if ((uVar3 & 1) != 0) {
        pdVar14[lVar2] = pdVar14[lVar2] * dVar18 + pdVar14[lVar2];
      }
      dVar18 = dVar18 * dVar18;
      adStack_70[2] = dVar19 * (1.0 - dVar18);
      iVar4 = 0;
    }
    else {
      lVar2 = local_50 - uVar3;
      adStack_70[2] = dVar19;
      pdVar14[-1] = 3.60809125425691e-317;
      memset(pdVar14 + uVar3,0,lVar2 * 8);
      iVar4 = 10;
      uVar9 = local_48;
      dVar18 = extraout_XMM0_Qa;
      dVar17 = adStack_70[3];
    }
    fVar16 = SUB84(dVar18,0);
    pdVar11 = pdVar11 + 1;
    pdVar12 = pdVar12 + 1;
    uVar3 = uVar3 + 1;
    dVar19 = adStack_70[2];
  } while (iVar4 == 0);
  if (iVar4 == 10) {
LAB_006f6fab:
    if (0 < (int)local_38) {
      uVar9 = 0;
      dVar17 = 0.99;
      do {
        pdVar14[uVar9] = pdVar14[uVar9] * dVar17;
        dVar17 = dVar17 * 0.99;
        uVar9 = uVar9 + 1;
      } while ((local_38 & 0xffffffff) != uVar9);
    }
    if (0 < (int)local_38) {
      uVar9 = 0;
      do {
        local_40[uVar9] = (float)pdVar14[uVar9];
        uVar9 = uVar9 + 1;
      } while ((local_38 & 0xffffffff) != uVar9);
    }
    fVar16 = (float)dVar19;
  }
  return fVar16;
}

Assistant:

float vorbis_lpc_from_data(float *data,float *lpci,int n,int m){
  double *aut=alloca(sizeof(*aut)*(m+1));
  double *lpc=alloca(sizeof(*lpc)*(m));
  double error;
  double epsilon;
  int i,j;

  /* autocorrelation, p+1 lag coefficients */
  j=m+1;
  while(j--){
    double d=0; /* double needed for accumulator depth */
    for(i=j;i<n;i++)d+=(double)data[i]*data[(i-j)];
    aut[j]=d;
  }

  /* Generate lpc coefficients from autocorr values */

  /* set our noise floor to about -100dB */
  error=aut[0] * (1. + 1e-10);
  epsilon=1e-9*aut[0]+1e-10;

  for(i=0;i<m;i++){
    double r= -aut[i+1];

    if(error<epsilon){
      memset(lpc+i,0,(m-i)*sizeof(*lpc));
      goto done;
    }

    /* Sum up this iteration's reflection coefficient; note that in
       Vorbis we don't save it.  If anyone wants to recycle this code
       and needs reflection coefficients, save the results of 'r' from
       each iteration. */

    for(j=0;j<i;j++)r-=lpc[j]*aut[i-j];
    r/=error;

    /* Update LPC coefficients and total error */

    lpc[i]=r;
    for(j=0;j<i/2;j++){
      double tmp=lpc[j];

      lpc[j]+=r*lpc[i-1-j];
      lpc[i-1-j]+=r*tmp;
    }
    if(i&1)lpc[j]+=lpc[j]*r;

    error*=1.-r*r;

  }

 done:

  /* slightly damp the filter */
  {
    double g = .99;
    double damp = g;
    for(j=0;j<m;j++){
      lpc[j]*=damp;
      damp*=g;
    }
  }

  for(j=0;j<m;j++)lpci[j]=(float)lpc[j];

  /* we need the error value to know how big an impulse to hit the
     filter with later */

  return (float)error;
}